

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

bool __thiscall
iutest::detail::PairMatcher<iutest::detail::AnythingMatcher,iutest::detail::NeMatcher<int>>::
CheckElem<int,iutest::detail::NeMatcher<int>>
          (PairMatcher<iutest::detail::AnythingMatcher,iutest::detail::NeMatcher<int>> *this,
          int *actual,NeMatcher<int> *matcher)

{
  bool bVar1;
  NeMatcher<int> *this_00;
  AssertionResult local_48;
  NeMatcher<int> *local_20;
  NeMatcher<int> *matcher_local;
  int *actual_local;
  PairMatcher<iutest::detail::AnythingMatcher,_iutest::detail::NeMatcher<int>_> *this_local;
  
  local_20 = matcher;
  matcher_local = (NeMatcher<int> *)actual;
  actual_local = (int *)this;
  this_00 = CastToMatcher<iutest::detail::NeMatcher<int>>
                      (matcher,(type **)&iutest_type_traits::enabler_t<void>::value);
  NeMatcher<int>::operator()(&local_48,this_00,(int *)matcher_local);
  bVar1 = AssertionResult::operator_cast_to_bool(&local_48);
  AssertionResult::~AssertionResult(&local_48);
  return bVar1;
}

Assistant:

bool CheckElem(const T& actual, U& matcher)
    {
        return static_cast<bool>(CastToMatcher(matcher)(actual));
    }